

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O0

QDebug QtPrivate::printAssociativeContainer<QHash<QNetworkRequest::KnownHeaders,QVariant>>
                 (QDebug *debug,char *which,QHash<QNetworkRequest::KnownHeaders,_QVariant> *c)

{
  bool bVar1;
  QDebug *o;
  QHash<QNetworkRequest::KnownHeaders,_QVariant> *in_RCX;
  undefined8 in_RDX;
  QVariant *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  const_iterator it;
  QDebugStateSaver saver;
  QDebug *in_stack_ffffffffffffff78;
  char t;
  Stream *this;
  QVariant *dbg;
  QDebug local_48;
  QDebug local_40;
  QDebug in_stack_ffffffffffffffc8;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = 0xaaaaaaaaaaaaaaaa;
  this = in_RDI;
  dbg = in_RSI;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_10,(QDebug *)in_RSI);
  QDebug::nospace((QDebug *)in_RSI);
  QDebug::operator<<((QDebug *)in_RCX,(char *)in_stack_ffffffffffffffc8.stream);
  QDebug::operator<<((QDebug *)in_RCX,(char *)in_stack_ffffffffffffffc8.stream);
  QHash<QNetworkRequest::KnownHeaders,_QVariant>::constBegin(in_RCX);
  while( true ) {
    QHash<QNetworkRequest::KnownHeaders,_QVariant>::constEnd
              ((QHash<QNetworkRequest::KnownHeaders,_QVariant> *)this);
    bVar1 = QHash<QNetworkRequest::KnownHeaders,_QVariant>::const_iterator::operator!=
                      ((const_iterator *)this,(const_iterator *)in_RDI);
    t = (char)((ulong)in_stack_ffffffffffffff78 >> 0x38);
    if (!bVar1) break;
    o = QDebug::operator<<((QDebug *)in_RDI,t);
    QDebug::QDebug(&local_48,o);
    QHash<QNetworkRequest::KnownHeaders,_QVariant>::const_iterator::key((const_iterator *)0x2e90ac);
    ::operator<<((QDebug *)dbg,(KnownHeaders)((ulong)in_RDX >> 0x20));
    in_stack_ffffffffffffff78 =
         QDebug::operator<<((QDebug *)in_RCX,(char *)in_stack_ffffffffffffffc8.stream);
    QHash<QNetworkRequest::KnownHeaders,_QVariant>::const_iterator::value
              ((const_iterator *)0x2e90dc);
    ::operator<<((QDebug *)in_RCX,in_RSI);
    QDebug::operator<<((QDebug *)in_RDI,(char)((ulong)in_stack_ffffffffffffff78 >> 0x38));
    QDebug::~QDebug((QDebug *)&stack0xffffffffffffffc8);
    QDebug::~QDebug(&local_40);
    QDebug::~QDebug(&local_48);
    QHash<QNetworkRequest::KnownHeaders,_QVariant>::const_iterator::operator++
              ((const_iterator *)in_RSI);
  }
  QDebug::operator<<((QDebug *)in_RDI,t);
  QDebug::QDebug((QDebug *)in_RDI,in_stack_ffffffffffffff78);
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDebug)this;
  }
  __stack_chk_fail();
}

Assistant:

inline QDebug printAssociativeContainer(QDebug debug, const char *which, const AssociativeContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << "(";
    for (typename AssociativeContainer::const_iterator it = c.constBegin();
         it != c.constEnd(); ++it) {
        debug << '(' << it.key() << ", " << it.value() << ')';
    }
    debug << ')';
    return debug;
}